

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrapolation.cc
# Opt level: O2

void __thiscall
tchecker::zg::details::local_m_extrapolation_t::local_m_extrapolation_t
          (local_m_extrapolation_t *this,local_m_extrapolation_t *e)

{
  map_t *pmVar1;
  
  (this->super_extrapolation_t)._vptr_extrapolation_t =
       (_func_int **)&PTR__local_m_extrapolation_t_00290a00;
  this->_m = (map_t *)0x0;
  std::__shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&(this->_clock_bounds).
                super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>
               ,&(e->_clock_bounds).
                 super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>
              );
  pmVar1 = clockbounds::clone_map(e->_m);
  this->_m = pmVar1;
  return;
}

Assistant:

local_m_extrapolation_t::local_m_extrapolation_t(tchecker::zg::details::local_m_extrapolation_t const & e)
    : _m(nullptr), _clock_bounds(e._clock_bounds)
{
  _m = tchecker::clockbounds::clone_map(*e._m);
}